

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O0

int crypt_dtor(LIBSSH2_SESSION *session,void **abstract)

{
  crypt_ctx **cctx;
  void **abstract_local;
  LIBSSH2_SESSION *session_local;
  
  if ((abstract != (void **)0x0) && (*abstract != (void *)0x0)) {
    EVP_CIPHER_CTX_reset(*(undefined8 *)((long)*abstract + 0x10));
    (*session->free)(*abstract,&session->abstract);
    *abstract = (void *)0x0;
  }
  return 0;
}

Assistant:

static int
crypt_dtor(LIBSSH2_SESSION * session, void **abstract)
{
    struct crypt_ctx **cctx = (struct crypt_ctx **) abstract;
    if (cctx && *cctx) {
        _libssh2_cipher_dtor(&(*cctx)->h);
        LIBSSH2_FREE(session, *cctx);
        *abstract = NULL;
    }
    return 0;
}